

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

void ssh2_transport_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  PktInQueue *pPVar1;
  Ssh *pSVar2;
  long *plVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  unsigned_long diff;
  char *pcVar10;
  PktInQueue *pPVar11;
  _func_void_ssh_version_receiver_ptr_int *p_Var12;
  Seat *pSVar13;
  Interactor *pIVar14;
  uint uVar15;
  Seat *pSVar16;
  bool bVar17;
  int secondary;
  PacketProtocolLayerVtable *pPVar18;
  PacketProtocolLayerVtable *local_38;
  
  if (ppl->vt == &ssh2_transport_vtable) {
    uVar7 = conf_get_int(conf,0x1b);
    uVar15 = 0x3c;
    if (uVar7 < 0x8bd0) {
      uVar15 = uVar7;
    }
    _Var4 = ssh2_transport_timer_update
                      ((ssh2_transport_state *)&ppl[-0xd].ic_process_queue,(long)(int)uVar15);
    pPVar18 = (PacketProtocolLayerVtable *)0x0;
    local_38 = (PacketProtocolLayerVtable *)"timeout shortened";
    if (!_Var4) {
      local_38 = pPVar18;
    }
    pPVar1 = ppl[-0xb].in_pq;
    pcVar10 = conf_get_str((Conf *)ppl[-0xc].interactor,0x1c);
    pPVar11 = (PktInQueue *)parse_blocksize(pcVar10);
    ppl[-0xb].in_pq = pPVar11;
    pSVar16 = (Seat *)((long)pPVar1 - (long)pPVar11);
    if (pPVar11 != (PktInQueue *)0x0 && pSVar16 != (Seat *)0x0) {
      pSVar2 = ppl[-10].ssh;
      if (pPVar11 < pPVar1) {
        if (*(char *)&pSVar2->conf != '\0') {
          pSVar13 = (Seat *)(pSVar2->version_receiver).got_ssh_version;
          p_Var12 = (_func_void_ssh_version_receiver_ptr_int *)((long)pSVar13 - (long)pSVar16);
          if (pSVar13 < pSVar16 || p_Var12 == (_func_void_ssh_version_receiver_ptr_int *)0x0) {
            *(undefined2 *)&pSVar2->conf = 0x100;
          }
          else {
            (pSVar2->version_receiver).got_ssh_version = p_Var12;
          }
        }
        if (*(char *)&pSVar2->s == '\x01') {
          pSVar13 = (Seat *)((long)pSVar2->seat - (long)pSVar16);
          if (pSVar2->seat < pSVar16 || pSVar13 == (Seat *)0x0) {
            *(undefined2 *)&pSVar2->s = 0x100;
          }
          else {
            pSVar2->seat = pSVar13;
          }
        }
        if ((*(char *)((long)&pSVar2->conf + 1) != '\0') ||
           (*(char *)((long)&pSVar2->s + 1) == '\x01')) {
          local_38 = (PacketProtocolLayerVtable *)0x17aca7;
        }
      }
      else {
        if (*(char *)&pSVar2->conf != '\0') {
          (pSVar2->version_receiver).got_ssh_version =
               (pSVar2->version_receiver).got_ssh_version + ((long)pPVar11 - (long)pPVar1);
        }
        if (*(char *)&pSVar2->s == '\x01') {
          pSVar2->seat = (Seat *)((long)pSVar2->seat + ((long)pPVar11 - (long)pPVar1));
        }
      }
    }
    _Var4 = conf_get_bool((Conf *)ppl[-0xc].interactor,0x17);
    _Var5 = conf_get_bool(conf,0x17);
    bVar17 = _Var5 != _Var4;
    pcVar10 = "compression setting changed";
    if (!bVar17) {
      pcVar10 = (char *)local_38;
    }
    do {
      secondary = (int)pPVar18;
      iVar8 = conf_get_int_int((Conf *)ppl[-0xc].interactor,0x20,secondary);
      iVar9 = conf_get_int_int(conf,0x20,secondary);
      if (iVar8 != iVar9) {
        bVar17 = true;
        pcVar10 = "cipher settings changed";
      }
      pPVar18 = (PacketProtocolLayerVtable *)(ulong)(secondary + 1U);
    } while (secondary + 1U != 7);
    _Var4 = conf_get_bool((Conf *)ppl[-0xc].interactor,0x24);
    _Var5 = conf_get_bool(conf,0x24);
    if (_Var5 != _Var4) {
      pcVar10 = "cipher settings changed";
    }
    conf_free((Conf *)ppl[-0xc].interactor);
    pIVar14 = (Interactor *)conf_copy(conf);
    ppl[-0xc].interactor = pIVar14;
    if ((PacketProtocolLayerVtable *)pcVar10 != (PacketProtocolLayerVtable *)0x0) {
      if ((*(char *)&ppl[-9].in_pq != '\0') || (_Var6 = ssh2_bpp_rekey_inadvisable(ppl->bpp), _Var6)
         ) {
        if ((bool)(_Var5 != _Var4 | bVar17)) {
          ppl[-9].ic_process_queue.ctx = pcVar10;
        }
      }
      else {
        ppl[-0xb].vt = (PacketProtocolLayerVtable *)pcVar10;
        *(undefined4 *)&ppl[-0xb].bpp = 3;
        queue_idempotent_callback(&ppl->ic_process_queue);
      }
    }
    plVar3 = (long *)ppl[-0xd].ic_process_queue.ctx;
    (**(code **)(*plVar3 + 0x20))(plVar3,conf);
    return;
  }
  __assert_fail("ppl->vt == &ssh2_transport_vtable",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                ,0x86e,"void ssh2_transport_reconfigure(PacketProtocolLayer *, Conf *)");
}

Assistant:

static void ssh2_transport_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh2_transport_state *s;
    const char *rekey_reason = NULL;
    bool rekey_mandatory = false;
    unsigned long old_max_data_size, rekey_time;
    int i;

    assert(ppl->vt == &ssh2_transport_vtable);
    s = container_of(ppl, struct ssh2_transport_state, ppl);

    rekey_time = sanitise_rekey_time(
        conf_get_int(conf, CONF_ssh_rekey_time), 60);
    if (ssh2_transport_timer_update(s, rekey_time))
        rekey_reason = "timeout shortened";

    old_max_data_size = s->max_data_size;
    ssh2_transport_set_max_data_size(s);
    if (old_max_data_size != s->max_data_size &&
        s->max_data_size != 0) {
        if (s->max_data_size < old_max_data_size) {
            unsigned long diff = old_max_data_size - s->max_data_size;

            dts_consume(&s->stats->out, diff);
            dts_consume(&s->stats->in, diff);
            if (s->stats->out.expired || s->stats->in.expired)
                rekey_reason = "data limit lowered";
        } else {
            unsigned long diff = s->max_data_size - old_max_data_size;
            if (s->stats->out.running)
                s->stats->out.remaining += diff;
            if (s->stats->in.running)
                s->stats->in.remaining += diff;
        }
    }

    if (conf_get_bool(s->conf, CONF_compression) !=
        conf_get_bool(conf, CONF_compression)) {
        rekey_reason = "compression setting changed";
        rekey_mandatory = true;
    }

    for (i = 0; i < CIPHER_MAX; i++)
        if (conf_get_int_int(s->conf, CONF_ssh_cipherlist, i) !=
            conf_get_int_int(conf, CONF_ssh_cipherlist, i)) {
        rekey_reason = "cipher settings changed";
        rekey_mandatory = true;
    }
    if (conf_get_bool(s->conf, CONF_ssh2_des_cbc) !=
        conf_get_bool(conf, CONF_ssh2_des_cbc)) {
        rekey_reason = "cipher settings changed";
        rekey_mandatory = true;
    }

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (rekey_reason) {
        if (!s->kex_in_progress && !ssh2_bpp_rekey_inadvisable(s->ppl.bpp)) {
            s->rekey_reason = rekey_reason;
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        } else if (rekey_mandatory) {
            s->deferred_rekey_reason = rekey_reason;
        }
    }

    /* Also pass the configuration along to our higher layer */
    ssh_ppl_reconfigure(s->higher_layer, conf);
}